

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

uint32 __thiscall rw::StreamMemory::write8(StreamMemory *this,void *data,uint32 len)

{
  uint uVar1;
  uint32 local_28;
  uint32 l;
  uint32 len_local;
  void *data_local;
  StreamMemory *this_local;
  
  uVar1 = (*(this->super_Stream)._vptr_Stream[7])();
  if ((uVar1 & 1) == 0) {
    local_28 = len;
    if (this->length < this->position + len) {
      if (this->capacity < this->position + len) {
        local_28 = this->capacity - this->position;
      }
      this->length = this->position + local_28;
    }
    memcpy(this->data + this->position,data,(ulong)local_28);
    this->position = local_28 + this->position;
    if (len != local_28) {
      this->position = 0xffffffff;
    }
    this_local._4_4_ = local_28;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32
StreamMemory::write8(const void *data, uint32 len)
{
	if(this->eof())
		return 0;
	uint32 l = len;
	if(this->position+l > this->length){
		if(this->position+l > this->capacity)
			l = this->capacity-this->position;
		this->length = this->position+l;
	}
	memcpy(&this->data[this->position], data, l);
	this->position += l;
	if(len != l)
		this->position = S_EOF;
	return l;
}